

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

bool __thiscall r_comp::Class::is_fact(Class *this,Metadata *metadata)

{
  Metadata *this_00;
  byte bVar1;
  pointer ppVar2;
  bool bVar3;
  byte local_b2;
  allocator local_89;
  string local_88 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
  local_68 [3];
  allocator local_49;
  string local_48 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
  local_28;
  Metadata *local_20;
  Metadata *metadata_local;
  Class *this_local;
  
  local_20 = metadata;
  metadata_local = (Metadata *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"fact",&local_49);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
       ::find(&metadata->classes,(key_type *)local_48);
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                         *)&local_28);
  bVar1 = r_code::Atom::operator==(&(ppVar2->second).atom,&this->atom);
  this_00 = local_20;
  bVar3 = (bVar1 & 1) == 0;
  local_b2 = 1;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"|fact",&local_89);
    local_68[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
         ::find(&this_00->classes,(key_type *)local_88);
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                           *)local_68);
    local_b2 = r_code::Atom::operator==(&(ppVar2->second).atom,&this->atom);
  }
  this_local._7_1_ = local_b2 & 1;
  if (bVar3) {
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Class::is_fact(Metadata *metadata) const
{
    return (metadata->classes.find("fact")->second.atom == atom) || (metadata->classes.find("|fact")->second.atom == atom);
}